

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode
TA_SetInputParamPricePtr
          (TA_ParamHolder *param,uint paramIndex,TA_Real *open,TA_Real *high,TA_Real *low,
          TA_Real *close,TA_Real *volume,TA_Real *openInterest)

{
  int *piVar1;
  int *piVar2;
  TA_FuncInfo *funcInfo;
  TA_InputParameterInfo *paramInfo;
  TA_ParamHolderPriv *paramHolderPriv;
  TA_Real *close_local;
  TA_Real *low_local;
  TA_Real *high_local;
  TA_Real *open_local;
  uint paramIndex_local;
  TA_ParamHolder *param_local;
  TA_RetCode local_4;
  
  if (param == (TA_ParamHolder *)0x0) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    piVar1 = (int *)param->hiddenData;
    if (*piVar1 == -0x5dfd4dfe) {
      if (*(long *)(piVar1 + 10) == 0) {
        local_4 = TA_INVALID_HANDLE;
      }
      else if (paramIndex < *(uint *)(*(long *)(piVar1 + 10) + 0x24)) {
        piVar2 = *(int **)(*(long *)(piVar1 + 2) + (ulong)paramIndex * 0x38 + 0x30);
        if (piVar2 == (int *)0x0) {
          local_4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
        }
        else if (*piVar2 == 0) {
          if ((piVar2[4] & 1U) != 0) {
            if (open == (TA_Real *)0x0) {
              return TA_BAD_PARAM;
            }
            *(TA_Real **)(*(long *)(piVar1 + 2) + (ulong)paramIndex * 0x38) = open;
          }
          if ((piVar2[4] & 2U) != 0) {
            if (high == (TA_Real *)0x0) {
              return TA_BAD_PARAM;
            }
            *(TA_Real **)(*(long *)(piVar1 + 2) + (ulong)paramIndex * 0x38 + 8) = high;
          }
          if ((piVar2[4] & 4U) != 0) {
            if (low == (TA_Real *)0x0) {
              return TA_BAD_PARAM;
            }
            *(TA_Real **)(*(long *)(piVar1 + 2) + (ulong)paramIndex * 0x38 + 0x10) = low;
          }
          if ((piVar2[4] & 8U) != 0) {
            if (close == (TA_Real *)0x0) {
              return TA_BAD_PARAM;
            }
            *(TA_Real **)(*(long *)(piVar1 + 2) + (ulong)paramIndex * 0x38 + 0x18) = close;
          }
          if ((piVar2[4] & 0x10U) != 0) {
            if (volume == (TA_Real *)0x0) {
              return TA_BAD_PARAM;
            }
            *(TA_Real **)(*(long *)(piVar1 + 2) + (ulong)paramIndex * 0x38 + 0x20) = volume;
          }
          if ((piVar2[4] & 0x20U) != 0) {
            if (openInterest == (TA_Real *)0x0) {
              return TA_BAD_PARAM;
            }
            *(TA_Real **)(*(long *)(piVar1 + 2) + (ulong)paramIndex * 0x38 + 0x28) = openInterest;
          }
          piVar1[8] = (1 << ((byte)paramIndex & 0x1f) ^ 0xffffffffU) & piVar1[8];
          local_4 = TA_SUCCESS;
        }
        else {
          local_4 = TA_INVALID_PARAM_HOLDER_TYPE;
        }
      }
      else {
        local_4 = TA_BAD_PARAM;
      }
    }
    else {
      local_4 = TA_INVALID_PARAM_HOLDER;
    }
  }
  return local_4;
}

Assistant:

TA_RetCode TA_SetInputParamPricePtr( TA_ParamHolder     *param,
                                     unsigned int        paramIndex,
                                     const TA_Real      *open,
                                     const TA_Real      *high,
                                     const TA_Real      *low,
                                     const TA_Real      *close,
                                     const TA_Real      *volume,
                                     const TA_Real      *openInterest )
{

   TA_ParamHolderPriv *paramHolderPriv;
   const TA_InputParameterInfo *paramInfo;
   const TA_FuncInfo *funcInfo;

   if( param == NULL )
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Make sure this index really exist. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;
   if( paramIndex >= funcInfo->nbInput )
   {
      return TA_BAD_PARAM;
   }

   /* Verify the type of the parameter. */
   paramInfo = paramHolderPriv->in[paramIndex].inputInfo;
   if( !paramInfo ) return TA_INTERNAL_ERROR(2);
   if( paramInfo->type != TA_Input_Price )
   {
      return TA_INVALID_PARAM_HOLDER_TYPE;
   }

   /* keep a copy of the provided parameter. */
   #define SET_PARAM_INFO(lowerParam,upperParam) \
   { \
      if( paramInfo->flags & TA_IN_PRICE_##upperParam ) \
      { \
         if( lowerParam == NULL ) \
         { \
            return TA_BAD_PARAM; \
         } \
         paramHolderPriv->in[paramIndex].data.inPrice.lowerParam = lowerParam; \
      } \
   }

   SET_PARAM_INFO(open, OPEN );
   SET_PARAM_INFO(high, HIGH );
   SET_PARAM_INFO(low, LOW );
   SET_PARAM_INFO(close, CLOSE );
   SET_PARAM_INFO(volume, VOLUME );
   SET_PARAM_INFO(openInterest, OPENINTEREST );

   #undef SET_PARAM_INFO

   /* This parameter is now initialized, clear the corresponding bit. */
   paramHolderPriv->inBitmap &= ~(1<<paramIndex);

   return TA_SUCCESS;
}